

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_console.c
# Opt level: O0

void golf_debug_console_update(float dt)

{
  _func_void *p_Var1;
  bool bVar2;
  golf_debug_console_tab_t tab;
  int i;
  float dt_local;
  
  if ((inputs->button_clicked[0x60] & 1U) != 0) {
    golf_debug_console_update::debug_console_open =
         (_Bool)((golf_debug_console_update::debug_console_open ^ 0xffU) & 1);
  }
  if ((golf_debug_console_update::debug_console_open & 1U) != 0) {
    igSetNextWindowSize((ImVec2)0x43fa000043fa0000,4);
    igSetNextWindowPos((ImVec2)0x40a0000040a00000,4,(ImVec2)0x0);
    bVar2 = igBegin("Debug Console",&golf_debug_console_update::debug_console_open,0);
    if (bVar2) {
      bVar2 = igBeginTabBar("##Tabs",0);
      if (bVar2) {
        bVar2 = igBeginTabItem("Main",(bool *)0x0,0);
        if (bVar2) {
          _debug_console_main_tab();
          igEndTabItem();
        }
        bVar2 = igBeginTabItem("Data",(bool *)0x0,0);
        if (bVar2) {
          golf_data_debug_console_tab();
          igEndTabItem();
        }
        bVar2 = igBeginTabItem("Graphics",(bool *)0x0,0);
        if (bVar2) {
          golf_graphics_debug_console_tab();
          igEndTabItem();
        }
        for (tab.fn._0_4_ = 0; (int)tab.fn < debug_console.tabs.length;
            tab.fn._0_4_ = (int)tab.fn + 1) {
          p_Var1 = debug_console.tabs.data[(int)tab.fn].fn;
          bVar2 = igBeginTabItem(debug_console.tabs.data[(int)tab.fn].name,(bool *)0x0,0);
          if (bVar2) {
            (*p_Var1)();
            igEndTabItem();
          }
        }
        igEndTabBar();
      }
      igEnd();
    }
  }
  return;
}

Assistant:

void golf_debug_console_update(float dt) {
    GOLF_UNUSED(dt);

    static bool debug_console_open = false;
    if (inputs->button_clicked[SAPP_KEYCODE_GRAVE_ACCENT]) {
        debug_console_open = !debug_console_open;
    }

    if (debug_console_open) {
        igSetNextWindowSize((ImVec2){500, 500}, ImGuiCond_FirstUseEver);
        igSetNextWindowPos((ImVec2){5, 5}, ImGuiCond_FirstUseEver, (ImVec2){0, 0});
        if (igBegin("Debug Console", &debug_console_open, ImGuiWindowFlags_None)) {
            if (igBeginTabBar("##Tabs", ImGuiTabBarFlags_None)) {
                if (igBeginTabItem("Main", NULL, ImGuiTabItemFlags_None)) {
                    _debug_console_main_tab();
                    igEndTabItem();
                }
                if (igBeginTabItem("Data", NULL, ImGuiTabItemFlags_None)) {
                    golf_data_debug_console_tab();
                    igEndTabItem();
                }
                if (igBeginTabItem("Graphics", NULL, ImGuiTabItemFlags_None)) {
                    golf_graphics_debug_console_tab();
                    igEndTabItem();
                }
                for (int i = 0; i < debug_console.tabs.length; i++) {
                    golf_debug_console_tab_t tab = debug_console.tabs.data[i];
                    if (igBeginTabItem(tab.name, NULL, ImGuiTabItemFlags_None)) {
                        tab.fn();
                        igEndTabItem();
                    }
                }
                igEndTabBar();
            }
            igEnd();
        }
    }
}